

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O0

uint256 * __thiscall XOnlyPubKey::ComputeTapTweakHash(XOnlyPubKey *this,uint256 *merkle_root)

{
  long in_RDX;
  HashWriter *in_RDI;
  long in_FS_OFFSET;
  HashWriter *pHVar1;
  undefined1 local_d8 [104];
  undefined1 local_70 [104];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pHVar1 = in_RDI;
  if (in_RDX == 0) {
    memcpy(local_70,&HASHER_TAPTWEAK,0x68);
    HashWriter::operator<<(pHVar1,(uint256 *)in_RDI);
    HashWriter::GetSHA256(pHVar1);
  }
  else {
    memcpy(local_d8,&HASHER_TAPTWEAK,0x68);
    HashWriter::operator<<(pHVar1,(uint256 *)in_RDI);
    HashWriter::operator<<(pHVar1,(uint256 *)in_RDI);
    HashWriter::GetSHA256(pHVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (uint256 *)pHVar1;
  }
  __stack_chk_fail();
}

Assistant:

uint256 XOnlyPubKey::ComputeTapTweakHash(const uint256* merkle_root) const
{
    if (merkle_root == nullptr) {
        // We have no scripts. The actual tweak does not matter, but follow BIP341 here to
        // allow for reproducible tweaking.
        return (HashWriter{HASHER_TAPTWEAK} << m_keydata).GetSHA256();
    } else {
        return (HashWriter{HASHER_TAPTWEAK} << m_keydata << *merkle_root).GetSHA256();
    }
}